

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

int handle_posted_message(JSRuntime *rt,JSContext *ctx,JSWorkerMessageHandler *port)

{
  long lVar1;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue val;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue func_obj;
  JSValue v_02;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  long in_RDX;
  JSContext *in_RSI;
  JSValue JVar5;
  int ret_1;
  uint8_t buf [16];
  JSValue retval;
  JSValue func;
  JSValue data_obj;
  JSValue obj;
  JSWorkerMessage *msg;
  list_head *el;
  int ret;
  JSWorkerMessagePipe *ps;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffff24;
  JSValueUnion in_stack_ffffffffffffff28;
  JSValueUnion JVar7;
  JSValueUnion in_stack_ffffffffffffff30;
  JSValueUnion in_stack_ffffffffffffff38;
  int64_t iVar8;
  int64_t in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  JSValueUnion ctx_00;
  int64_t iVar9;
  int flags;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined1 local_88 [16];
  undefined4 local_78;
  int in_stack_ffffffffffffff8c;
  JSValue *in_stack_ffffffffffffff90;
  uint8_t *in_stack_ffffffffffffff98;
  JSContext *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_RDX + 0x10);
  pthread_mutex_lock((pthread_mutex_t *)(lVar1 + 8));
  iVar2 = list_empty((list_head *)(lVar1 + 0x30));
  if (iVar2 != 0) {
    pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 8));
    return 0;
  }
  list_del(*(list_head **)(lVar1 + 0x38));
  iVar2 = list_empty((list_head *)(lVar1 + 0x30));
  if (iVar2 != 0) {
    do {
      sVar3 = read(*(int *)(lVar1 + 0x40),local_88,0x10);
      in_stack_ffffffffffffff74 = (int)sVar3;
      if (-1 < in_stack_ffffffffffffff74) break;
      piVar4 = __errno_location();
    } while ((*piVar4 == 0xb) || (piVar4 = __errno_location(), *piVar4 == 4));
  }
  pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 8));
  JVar5 = JS_ReadObject(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                        (size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  flags = JVar5.u._0_4_;
  uVar10 = JVar5.u._4_4_;
  iVar8 = JVar5.tag;
  js_free_message((JSWorkerMessage *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
  iVar2 = JS_IsException(JVar5);
  if (iVar2 == 0) {
    JVar5 = JS_NewObject((JSContext *)0x113400);
    ctx_00 = JVar5.u;
    iVar9 = JVar5.tag;
    iVar2 = JS_IsException(JVar5);
    if (iVar2 == 0) {
      this_obj.u._4_4_ = in_stack_ffffffffffffff4c;
      this_obj.u.int32 = in_stack_ffffffffffffff48;
      this_obj.tag = (int64_t)ctx_00.ptr;
      val.tag = in_stack_ffffffffffffff40;
      val.u.float64 = in_stack_ffffffffffffff38.float64;
      JS_DefinePropertyValueStr
                ((JSContext *)in_stack_ffffffffffffff30.ptr,this_obj,
                 (char *)in_stack_ffffffffffffff28.ptr,val,flags);
      JVar5 = JS_DupValue(in_RSI,*(JSValue *)(in_RDX + 0x18));
      uVar6 = 0;
      JVar7.float64 = 1.48219693752374e-323;
      func_obj.tag._0_4_ = in_stack_ffffffffffffff70;
      func_obj.u = (JSValueUnion)iVar8;
      func_obj.tag._4_4_ = in_stack_ffffffffffffff74;
      this_obj_00.tag._0_4_ = flags;
      this_obj_00.u = (JSValueUnion)iVar9;
      this_obj_00.tag._4_4_ = uVar10;
      JVar5 = JS_Call((JSContext *)ctx_00.ptr,func_obj,this_obj_00,JVar5.tag._4_4_,
                      in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff30 = JVar5.u;
      iVar8 = JVar5.tag;
      local_78 = JVar5.u._0_4_;
      uVar10 = JVar5.u._4_4_;
      v.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
      v.u.ptr = JVar7.ptr;
      JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff24,uVar6),v);
      v_00.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
      v_00.u.ptr = JVar7.ptr;
      JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff24,uVar6),v_00);
      v_02.u._4_4_ = uVar10;
      v_02.u.int32 = local_78;
      v_02.tag = iVar8;
      iVar2 = JS_IsException(v_02);
      if (iVar2 == 0) {
        v_01.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
        v_01.u.ptr = JVar7.ptr;
        JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff24,uVar6),v_01);
        return 1;
      }
    }
    else {
      JVar5.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
      JVar5.u.ptr = in_stack_ffffffffffffff28.ptr;
      JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),JVar5)
      ;
    }
  }
  js_std_dump_error((JSContext *)in_stack_ffffffffffffff30.ptr);
  return 1;
}

Assistant:

static int handle_posted_message(JSRuntime *rt, JSContext *ctx,
                                 JSWorkerMessageHandler *port)
{
    JSWorkerMessagePipe *ps = port->recv_pipe;
    int ret;
    struct list_head *el;
    JSWorkerMessage *msg;
    JSValue obj, data_obj, func, retval;
    
    pthread_mutex_lock(&ps->mutex);
    if (!list_empty(&ps->msg_queue)) {
        el = ps->msg_queue.next;
        msg = list_entry(el, JSWorkerMessage, link);

        /* remove the message from the queue */
        list_del(&msg->link);

        if (list_empty(&ps->msg_queue)) {
            uint8_t buf[16];
            int ret;
            for(;;) {
                ret = read(ps->read_fd, buf, sizeof(buf));
                if (ret >= 0)
                    break;
                if (errno != EAGAIN && errno != EINTR)
                    break;
            }
        }

        pthread_mutex_unlock(&ps->mutex);

        data_obj = JS_ReadObject(ctx, msg->data, msg->data_len,
                                 JS_READ_OBJ_SAB | JS_READ_OBJ_REFERENCE);

        js_free_message(msg);
        
        if (JS_IsException(data_obj))
            goto fail;
        obj = JS_NewObject(ctx);
        if (JS_IsException(obj)) {
            JS_FreeValue(ctx, data_obj);
            goto fail;
        }
        JS_DefinePropertyValueStr(ctx, obj, "data", data_obj, JS_PROP_C_W_E);

        /* 'func' might be destroyed when calling itself (if it frees the
           handler), so must take extra care */
        func = JS_DupValue(ctx, port->on_message_func);
        retval = JS_Call(ctx, func, JS_UNDEFINED, 1, (JSValueConst *)&obj);
        JS_FreeValue(ctx, obj);
        JS_FreeValue(ctx, func);
        if (JS_IsException(retval)) {
        fail:
            js_std_dump_error(ctx);
        } else {
            JS_FreeValue(ctx, retval);
        }
        ret = 1;
    } else {
        pthread_mutex_unlock(&ps->mutex);
        ret = 0;
    }
    return ret;
}